

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O3

int Kit_GraphLeafDepth_rec(Kit_Graph_t *pGraph,Kit_Node_t *pNode,Kit_Node_t *pLeaf)

{
  Kit_Node_t *pKVar1;
  int iVar2;
  int iVar3;
  
  if (pNode != pLeaf) {
    pKVar1 = pGraph->pNodes;
    iVar2 = -100;
    if (pGraph->nLeaves <= (int)((ulong)((long)pNode - (long)pKVar1) >> 3) * -0x55555555) {
      iVar2 = Kit_GraphLeafDepth_rec(pGraph,pKVar1 + ((uint)pNode->eEdge0 >> 1 & 0x3fffffff),pLeaf);
      iVar3 = Kit_GraphLeafDepth_rec(pGraph,pKVar1 + ((uint)pNode->eEdge1 >> 1 & 0x3fffffff),pLeaf);
      if (iVar3 < iVar2) {
        iVar3 = iVar2;
      }
      iVar2 = iVar3 + 1;
      if (iVar3 == -100) {
        iVar2 = -100;
      }
    }
    return iVar2;
  }
  return 0;
}

Assistant:

int Kit_GraphLeafDepth_rec( Kit_Graph_t * pGraph, Kit_Node_t * pNode, Kit_Node_t * pLeaf )
{
    int Depth0, Depth1, Depth;
    if ( pNode == pLeaf )
        return 0;
    if ( Kit_GraphNodeIsVar(pGraph, pNode) )
        return -100;
    Depth0 = Kit_GraphLeafDepth_rec( pGraph, Kit_GraphNodeFanin0(pGraph, pNode), pLeaf );
    Depth1 = Kit_GraphLeafDepth_rec( pGraph, Kit_GraphNodeFanin1(pGraph, pNode), pLeaf );
    Depth = KIT_MAX( Depth0, Depth1 );
    Depth = (Depth == -100) ? -100 : Depth + 1;
    return Depth;
}